

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GetInt32(char *zNum,int *pValue)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  long lVar9;
  bool bVar10;
  
  cVar2 = *zNum;
  if (cVar2 == '-') {
    zNum = zNum + 1;
    lVar6 = -1;
  }
  else {
    if (cVar2 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar8 = (byte *)(zNum + 1);
        do {
          pbVar1 = pbVar8 + 1;
          pbVar8 = pbVar8 + 1;
        } while (*pbVar1 == 0x30);
        uVar7 = 0;
        lVar6 = 8;
        while ((bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10 &&
               (bVar3 = *pbVar8, (""[bVar3] & 8) != 0))) {
          uVar7 = uVar7 << 4 | (uint)(((char)(bVar3 * '\x02') >> 7 & 9U) + bVar3 & 0xf);
          pbVar8 = pbVar8 + 1;
        }
        if ((int)uVar7 < 0) {
          return 0;
        }
        if ((""[*pbVar8] & 8) != 0) {
          return 0;
        }
        *pValue = uVar7;
        return 1;
      }
    }
    else if (cVar2 == '+') {
      zNum = zNum + 1;
    }
    lVar6 = 0;
  }
  uVar5 = (ulong)(byte)*zNum;
  if (0xfffffffffffffff5 < uVar5 - 0x3a) {
    while ((char)uVar5 == '0') {
      uVar5 = (ulong)((byte *)zNum)[1];
      zNum = (char *)((byte *)zNum + 1);
    }
    lVar9 = 0;
    for (uVar5 = 0; uVar5 != 0xb; uVar5 = uVar5 + 1) {
      if (9 < (byte)(((byte *)zNum)[uVar5] - 0x30)) {
        bVar10 = 10 < uVar5;
        goto LAB_001538d6;
      }
      lVar9 = (ulong)(((byte *)zNum)[uVar5] & 0xf) + lVar9 * 10;
    }
    bVar10 = true;
LAB_001538d6:
    if ((!bVar10) && (lVar6 + lVar9 < 0x80000000)) {
      iVar4 = -(int)lVar9;
      if (cVar2 != '-') {
        iVar4 = (int)lVar9;
      }
      *pValue = iVar4;
      return 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; i<8 && sqlite3Isxdigit(zNum[i]); i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}